

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O0

void Abc_NodeSetTravIdCurrent(Abc_Obj_t *p)

{
  Abc_Ntk_t *pAVar1;
  Abc_Obj_t *p_local;
  
  pAVar1 = Abc_ObjNtk(p);
  Abc_NodeSetTravId(p,pAVar1->nTravIds);
  return;
}

Assistant:

static inline void        Abc_NodeSetTravIdCurrent( Abc_Obj_t * p )         { Abc_NodeSetTravId( p, Abc_ObjNtk(p)->nTravIds );                                      }